

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::InlineGeneratorVisitor::RenameLinkedVar::visit(RenameLinkedVar *this,SwitchStmt *stmt)

{
  Var *pVVar1;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&(stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pVVar1 = match(this,local_30._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if (pVVar1 != (Var *)0x0) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &pVVar1->super_enable_shared_from_this<kratos::Var>);
    SwitchStmt::set_target(stmt,(shared_ptr<kratos::Var> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return;
}

Assistant:

void visit(SwitchStmt* stmt) override {
            if (auto* v = match(stmt->target().get())) {
                stmt->set_target(v->shared_from_this());
            }
        }